

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void write_random_seed(void *data,int len)

{
  int iVar1;
  char *__file;
  ssize_t sVar2;
  char *ptr;
  int *piVar3;
  char *pcVar4;
  size_t __n;
  
  __n = (size_t)(uint)len;
  __file = make_filename(3,(char *)0x0);
  iVar1 = open(__file,0x41,0x180);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 == 2) {
      pcVar4 = make_filename(0,(char *)0x0);
      ptr = make_dir_path(pcVar4,0x1c0);
      if (ptr != (char *)0x0) {
        nonfatal("Unable to write random seed: %s",ptr);
        safefree(ptr);
        safefree(__file);
        __file = pcVar4;
        goto LAB_00117bfc;
      }
      safefree(pcVar4);
      iVar1 = open(__file,0x41,0x180);
      if (-1 < iVar1) goto LAB_00117b19;
      iVar1 = *piVar3;
    }
    pcVar4 = strerror(iVar1);
    nonfatal("Unable to write random seed: open(\"%s\") returned \'%s\'",__file,pcVar4);
  }
  else {
LAB_00117b19:
    while (0 < (int)__n) {
      sVar2 = write(iVar1,data,__n);
      if ((int)sVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        nonfatal("Unable to write random seed: write returned \'%s\'",pcVar4);
        break;
      }
      __n = (size_t)(uint)((int)__n - (int)sVar2);
      data = (void *)((long)data + __n);
    }
    close(iVar1);
  }
LAB_00117bfc:
  safefree(__file);
  return;
}

Assistant:

void write_random_seed(void *data, int len)
{
    int fd;
    char *fname;

    fname = make_filename(INDEX_RANDSEED, NULL);
    /*
     * Don't truncate the random seed file if it already exists; if
     * something goes wrong half way through writing it, it would
     * be better to leave the old data there than to leave it empty.
     */
    fd = open(fname, O_CREAT | O_WRONLY, 0600);
    if (fd < 0) {
        if (errno != ENOENT) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
        char *dir, *errmsg;

        dir = make_filename(INDEX_DIR, NULL);
        if ((errmsg = make_dir_path(dir, 0700)) != NULL) {
            nonfatal("Unable to write random seed: %s", errmsg);
            sfree(errmsg);
            sfree(fname);
            sfree(dir);
            return;
        }
        sfree(dir);

        fd = open(fname, O_CREAT | O_WRONLY, 0600);
        if (fd < 0) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
    }

    while (len > 0) {
        int ret = write(fd, data, len);
        if (ret < 0) {
            nonfatal("Unable to write random seed: write "
                     "returned '%s'", strerror(errno));
            break;
        }
        len -= ret;
        data = (char *)data + len;
    }

    close(fd);
    sfree(fname);
}